

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<pbrt::Bounds2<int>&>(FileLoc *loc,char *fmt,Bounds2<int> *args)

{
  Bounds2<int> *in_RCX;
  string local_30;
  
  StringPrintf<pbrt::Bounds2<int>&>(&local_30,(pbrt *)fmt,(char *)args,in_RCX);
  ErrorExit(loc,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}